

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

char * gotcha_getenv(char *name)

{
  int max_length;
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  int name_len;
  char **s;
  long *local_18;
  
  sVar2 = gotcha_strlen(in_RDI);
  max_length = (int)sVar2;
  local_18 = ___environ;
  while( true ) {
    if (*local_18 == 0) {
      return (char *)0x0;
    }
    iVar1 = gotcha_strncmp(in_RDI,(char *)*local_18,max_length);
    if ((iVar1 == 0) && (*(char *)(*local_18 + (long)max_length) == '=')) break;
    local_18 = local_18 + 1;
  }
  return (char *)(*local_18 + (long)max_length + 1);
}

Assistant:

char *gotcha_getenv(const char *name) 
{
   char **s;
   int name_len;

   name_len = gotcha_strlen(name);
   for (s = __environ; *s; s++) {
      if (gotcha_strncmp(name, *s, name_len) != 0)
         continue;
      if ((*s)[name_len] != '=')
         continue;
      return (*s) + name_len + 1;
   }
   return NULL;
}